

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O2

bool burst::operator==(k_ary_search_set<int,_std::less<void>_> *set,initializer_list<int> *c)

{
  pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_const_int_*>
  pVar1;
  pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_const_int_*>
  pVar2;
  
  pVar2 = std::
          __mismatch<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((set->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (set->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,c->_M_array,c->_M_array + c->_M_len);
  pVar1.second = c->_M_array + c->_M_len;
  pVar1.first._M_current =
       (set->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  return pVar2 == pVar1;
}

Assistant:

bool operator == (const k_ary_search_set<Value, Compare> & set, const Collection & c)
    {
        return
            std::mismatch
            (
                set.begin(), set.end(),
                c.begin(), c.end()
            ) == std::make_pair(set.end(), c.end());
    }